

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
Lodtalk::EvaluationScope::EvaluationScope(EvaluationScope *this,EvaluationScopePtr *parentScope)

{
  this->_vptr_EvaluationScope = (_func_int **)&PTR__EvaluationScope_001706d8;
  std::__shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->parentScope).
              super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>,
             &parentScope->super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>)
  ;
  return;
}

Assistant:

EvaluationScope::EvaluationScope(const EvaluationScopePtr &parentScope)
	: parentScope(parentScope)
{
}